

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

void __thiscall
btCollisionWorld::serializeCollisionObjects(btCollisionWorld *this,btSerializer *serializer)

{
  btCollisionObject *pbVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  btCollisionShape *shape;
  btHashMap<btHashPtr,_btCollisionShape_*> serializedShapes;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_c0;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_b8;
  btHashMap<btHashPtr,_btCollisionShape_*> local_b0;
  
  local_b0.m_hashTable.m_ownsMemory = true;
  local_b0.m_hashTable.m_data = (int *)0x0;
  local_b0.m_hashTable.m_size = 0;
  local_b0.m_hashTable.m_capacity = 0;
  local_b0.m_next.m_ownsMemory = true;
  local_b0.m_next.m_data = (int *)0x0;
  local_b0.m_next.m_size = 0;
  local_b0.m_next.m_capacity = 0;
  local_b0.m_valueArray.m_ownsMemory = true;
  local_b0.m_valueArray.m_data = (btCollisionShape **)0x0;
  local_b0.m_valueArray.m_size = 0;
  local_b0.m_valueArray.m_capacity = 0;
  local_b0.m_keyArray.m_ownsMemory = true;
  local_b0.m_keyArray.m_data = (btHashPtr *)0x0;
  local_b0.m_keyArray.m_size = 0;
  local_b0.m_keyArray.m_capacity = 0;
  if (0 < (this->m_collisionObjects).m_size) {
    lVar4 = 0;
    do {
      local_c0 = (anon_union_8_2_511b660c_for_btHashPtr_0)
                 (this->m_collisionObjects).m_data[lVar4]->m_collisionShape;
      local_b8 = local_c0;
      iVar2 = btHashMap<btHashPtr,_btCollisionShape_*>::findIndex(&local_b0,(btHashPtr *)&local_b8);
      if ((iVar2 == -1) || (local_b0.m_valueArray.m_data == (btCollisionShape **)0x0)) {
        local_b8.m_pointer = local_c0.m_pointer;
        btHashMap<btHashPtr,_btCollisionShape_*>::insert
                  (&local_b0,(btHashPtr *)&local_b8,(btCollisionShape **)&local_c0.m_pointer);
        (**(code **)(*local_c0.m_pointer + 0x78))(local_c0.m_pointer,serializer);
      }
      lVar4 = lVar4 + 1;
      iVar2 = (this->m_collisionObjects).m_size;
      uVar3 = (ulong)iVar2;
    } while (lVar4 < (long)uVar3);
    if (0 < iVar2) {
      lVar4 = 0;
      do {
        pbVar1 = (this->m_collisionObjects).m_data[lVar4];
        if ((pbVar1->m_internalType == 0x40) || (pbVar1->m_internalType == 1)) {
          (*pbVar1->_vptr_btCollisionObject[6])(pbVar1,serializer);
          uVar3 = (ulong)(uint)(this->m_collisionObjects).m_size;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < (int)uVar3);
    }
  }
  btAlignedObjectArray<btHashPtr>::~btAlignedObjectArray(&local_b0.m_keyArray);
  btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&local_b0.m_valueArray);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_next);
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_b0.m_hashTable);
  return;
}

Assistant:

void	btCollisionWorld::serializeCollisionObjects(btSerializer* serializer)
{
	int i;

	///keep track of shapes already serialized
	btHashMap<btHashPtr,btCollisionShape*>	serializedShapes;

	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btCollisionShape* shape = colObj->getCollisionShape();

		if (!serializedShapes.find(shape))
		{
			serializedShapes.insert(shape,shape);
			shape->serializeSingleShape(serializer);
		}
	}

	//serialize all collision objects
	for (i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		if ((colObj->getInternalType() == btCollisionObject::CO_COLLISION_OBJECT) || (colObj->getInternalType() == btCollisionObject::CO_FEATHERSTONE_LINK))
		{
			colObj->serializeSingleObject(serializer);
		}
	}
}